

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void __thiscall
wabt::WastParser::WastParser
          (WastParser *this,WastLexer *lexer,Errors *errors,WastParseOptions *options)

{
  this->lexer_ = lexer;
  this->last_module_index_ = 0xffffffff;
  this->errors_ = errors;
  this->options_ = options;
  (this->tokens_).contents_._M_elems[0].loc.filename.data_ = (char *)0x0;
  (this->tokens_).contents_._M_elems[0].loc.filename.size_ = 0;
  *(undefined8 *)((long)&(this->tokens_).contents_._M_elems[0].loc.filename.size_ + 4) = 0;
  *(undefined8 *)((long)&(this->tokens_).contents_._M_elems[0].loc.field_1.field_1.offset + 4) = 0;
  (this->tokens_).contents_._M_elems[0].token_type_ = First;
  (this->tokens_).contents_._M_elems[1].loc.filename.data_ = (char *)0x0;
  (this->tokens_).contents_._M_elems[1].loc.filename.size_ = 0;
  *(undefined8 *)((long)&(this->tokens_).contents_._M_elems[1].loc.filename.size_ + 4) = 0;
  *(undefined8 *)((long)&(this->tokens_).contents_._M_elems[1].loc.field_1.field_1.offset + 4) = 0;
  (this->tokens_).contents_._M_elems[1].token_type_ = First;
  (this->tokens_).size_ = 0;
  (this->tokens_).front_ = 0;
  return;
}

Assistant:

WastParser::WastParser(WastLexer* lexer,
                       Errors* errors,
                       WastParseOptions* options)
    : lexer_(lexer), errors_(errors), options_(options) {}